

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * readFile(string *file_name)

{
  _Ios_Openmode _Var1;
  uchar *puVar2;
  string *in_RSI;
  allocator_type *in_RDI;
  streamsize size;
  ifstream f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  allocator_type *__n;
  fpos local_230 [16];
  streamoff local_220;
  char local_218 [536];
  
  __n = in_RDI;
  _Var1 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(local_218,in_RSI,_Var1);
  local_230 = (fpos  [16])std::istream::tellg();
  local_220 = std::fpos::operator_cast_to_long(local_230);
  std::istream::seekg((long)local_218,_S_beg);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10dc78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,(size_type)__n,in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10dc97);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10dca1);
  std::istream::read(local_218,(long)puVar2);
  std::ifstream::~ifstream(local_218);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n;
}

Assistant:

std::vector<uint8_t> readFile(const std::string &file_name) {
  std::ifstream f(file_name, std::ios::binary | std::ios::ate);
  std::streamsize size = f.tellg();
  f.seekg(0, std::ios::beg);

  auto buffer = std::vector<uint8_t>(static_cast<unsigned long>(size));
  f.read((char *) buffer.data(), size);
  return buffer;
}